

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

BOOL code_match(CodeContext *s,int pos,...)

{
  byte bVar1;
  uint8_t *puVar2;
  char in_AL;
  ulong uVar3;
  uint *puVar4;
  undefined8 in_RCX;
  uint uVar5;
  undefined8 in_RDX;
  uint *puVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  void *in_XMM3_Qa;
  uint local_d8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 uStack_88;
  va_list ap;
  
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    uStack_88 = in_XMM2_Qa;
    ap[0].overflow_arg_area = in_XMM3_Qa;
  }
  puVar2 = s->bc_buf;
  puVar6 = (uint *)&stack0x00000008;
  uVar5 = 0x10;
  iVar9 = -1;
switchD_001615cd_caseD_6:
  if (uVar5 < 0x29) {
    uVar3 = (ulong)uVar5;
    uVar5 = uVar5 + 8;
    puVar4 = (uint *)((long)local_d8 + uVar3);
  }
  else {
    puVar4 = puVar6;
    puVar6 = puVar6 + 2;
  }
  uVar7 = *puVar4;
  if (uVar7 == 0xffffffff) {
    s->pos = pos;
    s->line_num = iVar9;
    return 1;
  }
  iVar8 = pos;
  while( true ) {
    if (s->bc_len <= iVar8) {
      return 0;
    }
    bVar1 = puVar2[iVar8];
    pos = (uint)opcode_info[bVar1].size + iVar8;
    if (s->bc_len < pos) {
      return 0;
    }
    if (bVar1 != 0xc0) break;
    iVar9 = *(int *)(puVar2 + (long)iVar8 + 1);
    iVar8 = pos;
  }
  if (uVar7 != bVar1) {
    if (uVar7 < 0x100) {
      return 0;
    }
    if (bVar1 == 0) {
      return 0;
    }
    if ((((uVar7 >> 0x18 != (uint)bVar1) && (bVar1 != (byte)(uVar7 >> 0x10))) &&
        (bVar1 != (byte)uVar7)) && (bVar1 != (byte)(uVar7 >> 8))) {
      return 0;
    }
    s->op = (uint)bVar1;
  }
  switch(opcode_info[bVar1].fmt) {
  case '\x05':
  case '\a':
    uVar7 = (uint)puVar2[(long)iVar8 + 1];
    break;
  default:
    goto switchD_001615cd_caseD_6;
  case '\n':
  case '\r':
  case '\x10':
  case '\x11':
  case '\x12':
    uVar7 = (uint)*(ushort *)(puVar2 + (long)iVar8 + 1);
    break;
  case '\x13':
  case '\x14':
  case '\x15':
  case '\x16':
    s->label = *(int *)(puVar2 + (long)iVar8 + 1);
    goto switchD_001615cd_caseD_6;
  case '\x17':
    s->atom = *(JSAtom *)(puVar2 + (long)iVar8 + 1);
    goto switchD_001615cd_caseD_6;
  case '\x18':
    s->atom = *(JSAtom *)(puVar2 + (long)iVar8 + 1);
    s->val = (uint)puVar2[(long)iVar8 + 5];
    goto switchD_001615cd_caseD_6;
  case '\x19':
    s->atom = *(JSAtom *)(puVar2 + (long)iVar8 + 1);
    goto LAB_0016167f;
  case '\x1a':
    s->atom = *(JSAtom *)(puVar2 + (long)iVar8 + 1);
    s->label = *(int *)(puVar2 + (long)iVar8 + 5);
    s->val = (uint)puVar2[(long)iVar8 + 9];
    goto switchD_001615cd_caseD_6;
  case '\x1c':
    s->label = *(int *)(puVar2 + (long)iVar8 + 1);
LAB_0016167f:
    s->val = (uint)*(ushort *)(puVar2 + (long)iVar8 + 5);
    goto switchD_001615cd_caseD_6;
  }
  if (uVar5 < 0x29) {
    uVar3 = (ulong)uVar5;
    uVar5 = uVar5 + 8;
    puVar4 = (uint *)((long)local_d8 + uVar3);
  }
  else {
    puVar4 = puVar6;
    puVar6 = puVar6 + 2;
  }
  if (*puVar4 == 0xffffffff) {
    s->idx = uVar7;
  }
  else if (*puVar4 != uVar7) {
    return 0;
  }
  goto switchD_001615cd_caseD_6;
}

Assistant:

static BOOL code_match(CodeContext *s, int pos, ...)
{
    const uint8_t *tab = s->bc_buf;
    int op, len, op1, line_num, pos_next;
    va_list ap;
    BOOL ret = FALSE;

    line_num = -1;
    va_start(ap, pos);

    for(;;) {
        op1 = va_arg(ap, int);
        if (op1 == -1) {
            s->pos = pos;
            s->line_num = line_num;
            ret = TRUE;
            break;
        }
        for (;;) {
            if (pos >= s->bc_len)
                goto done;
            op = tab[pos];
            len = opcode_info[op].size;
            pos_next = pos + len;
            if (pos_next > s->bc_len)
                goto done;
            if (op == OP_line_num) {
                line_num = get_u32(tab + pos + 1);
                pos = pos_next;
            } else {
                break;
            }
        }
        if (op != op1) {
            if (op1 == (uint8_t)op1 || !op)
                break;
            if (op != (uint8_t)op1
            &&  op != (uint8_t)(op1 >> 8)
            &&  op != (uint8_t)(op1 >> 16)
            &&  op != (uint8_t)(op1 >> 24)) {
                break;
            }
            s->op = op;
        }

        pos++;
        switch(opcode_info[op].fmt) {
        case OP_FMT_loc8:
        case OP_FMT_u8:
            {
                int idx = tab[pos];
                int arg = va_arg(ap, int);
                if (arg == -1) {
                    s->idx = idx;
                } else {
                    if (arg != idx)
                        goto done;
                }
                break;
            }
        case OP_FMT_u16:
        case OP_FMT_npop:
        case OP_FMT_loc:
        case OP_FMT_arg:
        case OP_FMT_var_ref:
            {
                int idx = get_u16(tab + pos);
                int arg = va_arg(ap, int);
                if (arg == -1) {
                    s->idx = idx;
                } else {
                    if (arg != idx)
                        goto done;
                }
                break;
            }
        case OP_FMT_i32:
        case OP_FMT_u32:
        case OP_FMT_label:
        case OP_FMT_const:
            {
                s->label = get_u32(tab + pos);
                break;
            }
        case OP_FMT_label_u16:
            {
                s->label = get_u32(tab + pos);
                s->val = get_u16(tab + pos + 4);
                break;
            }
        case OP_FMT_atom:
            {
                s->atom = get_u32(tab + pos);
                break;
            }
        case OP_FMT_atom_u8:
            {
                s->atom = get_u32(tab + pos);
                s->val = get_u8(tab + pos + 4);
                break;
            }
        case OP_FMT_atom_u16:
            {
                s->atom = get_u32(tab + pos);
                s->val = get_u16(tab + pos + 4);
                break;
            }
        case OP_FMT_atom_label_u8:
            {
                s->atom = get_u32(tab + pos);
                s->label = get_u32(tab + pos + 4);
                s->val = get_u8(tab + pos + 8);
                break;
            }
        default:
            break;
        }
        pos = pos_next;
    }
 done:
    va_end(ap);
    return ret;
}